

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

shared_ptr<kratos::FinalStmtBlock> __thiscall kratos::Generator::final(Generator *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Generator *in_RSI;
  shared_ptr<kratos::FinalStmtBlock> sVar1;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::make_shared<kratos::FinalStmtBlock>();
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::FinalStmtBlock,void>
            (local_30,(__shared_ptr<kratos::FinalStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)this);
  add_stmt(in_RSI,(shared_ptr<kratos::Stmt> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  sVar1.super___shared_ptr<kratos::FinalStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::FinalStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::FinalStmtBlock>)
         sVar1.super___shared_ptr<kratos::FinalStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FinalStmtBlock> Generator::final() {
    auto stmt = std::make_shared<FinalStmtBlock>();
    add_stmt(stmt);
    return stmt;
}